

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O2

Literal * __thiscall
Shell::AnswerLiteralManager::getAnswerLiteral
          (AnswerLiteralManager *this,VList *vars,SList *srts,Formula *f)

{
  undefined1 *puVar1;
  Symbol *this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  OperatorType *type;
  Literal *pLVar5;
  uint arity;
  TermList elem;
  TermList sort;
  Stack<Kernel::TermList> local_58;
  
  if (getAnswerLiteral(Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*,Kernel::Formula*)::
      litArgs == '\0') {
    iVar4 = __cxa_guard_acquire(&getAnswerLiteral(Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*,Kernel::Formula*)
                                 ::litArgs);
    if (iVar4 != 0) {
      getAnswerLiteral::litArgs._cursor = (TermList *)0x0;
      getAnswerLiteral::litArgs._end = (TermList *)0x0;
      getAnswerLiteral::litArgs._capacity = 0;
      getAnswerLiteral::litArgs._stack = (TermList *)0x0;
      __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&getAnswerLiteral::litArgs,&__dso_handle);
      __cxa_guard_release(&getAnswerLiteral(Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*,Kernel::Formula*)
                           ::litArgs);
    }
  }
  getAnswerLiteral::litArgs._cursor = getAnswerLiteral::litArgs._stack;
  local_58._cursor = (TermList *)0x0;
  local_58._end = (TermList *)0x0;
  local_58._capacity = 0;
  local_58._stack = (TermList *)0x0;
  while (vars != (VList *)0x0) {
    uVar3 = vars->_head;
    vars = vars->_tail;
    sort._content = 2;
    if (srts == (SList *)0x0) {
      bVar2 = Kernel::SortHelper::tryGetVariableSort(uVar3,f,&sort);
      if (!bVar2) {
        sort = Kernel::AtomicSort::defaultSort();
      }
      srts = (List<Kernel::TermList> *)0x0;
    }
    else {
      sort._content = (srts->_head)._content;
      srts = srts->_tail;
    }
    elem._content._4_4_ = 0;
    elem._content._0_4_ = uVar3 * 4 + 1;
    Lib::Stack<Kernel::TermList>::push(&getAnswerLiteral::litArgs,elem);
    Lib::Stack<Kernel::TermList>::push(&local_58,sort);
  }
  arity = (uint)((ulong)((long)getAnswerLiteral::litArgs._cursor -
                        (long)getAnswerLiteral::litArgs._stack) >> 3);
  uVar3 = Kernel::Signature::addFreshPredicate(DAT_00a14190,arity,"ans",(char *)0x0);
  this_00 = (DAT_00a14190->_preds)._stack[uVar3];
  type = Kernel::OperatorType::getPredicateType
                   ((uint)((ulong)((long)local_58._cursor - (long)local_58._stack) >> 3),
                    local_58._stack,0);
  Kernel::Signature::Symbol::setType(this_00,type);
  puVar1 = &this_00->field_0x40;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x40408;
  pLVar5 = Kernel::Literal::create(uVar3,arity,true,getAnswerLiteral::litArgs._stack);
  Lib::Stack<Kernel::TermList>::~Stack(&local_58);
  return pLVar5;
}

Assistant:

Literal* AnswerLiteralManager::getAnswerLiteral(VList* vars,SList* srts,Formula* f)
{
  static Stack<TermList> litArgs;
  litArgs.reset();
  TermStack sorts;
  while(VList::isNonEmpty(vars)) {
    unsigned var = vars->head();
    vars = vars->tail();
    TermList sort;
    if (SList::isNonEmpty(srts)) {
      sort = srts->head();
      srts = srts->tail();
    } else if(!SortHelper::tryGetVariableSort(var, f, sort)) {
      sort = AtomicSort::defaultSort();
    }
    litArgs.push(TermList(var, false));
    sorts.push(sort);
  }

  unsigned vcnt = litArgs.size();
  unsigned pred = env.signature->addFreshPredicate(vcnt,"ans");
  Signature::Symbol* predSym = env.signature->getPredicate(pred);
  predSym->setType(OperatorType::getPredicateType(sorts.size(), sorts.begin()));
  predSym->markAnswerPredicate();
  // don't need equality proxy for answer literals
  predSym->markSkipCongruence();
  return Literal::create(pred, vcnt, true, litArgs.begin());
}